

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  long lVar1;
  TestFilter *pTVar2;
  undefined8 *in_RDI;
  TestFilter *current_1;
  TestFilter *current;
  size_t in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  void *mem;
  
  *in_RDI = &PTR__CommandLineArguments_00137c98;
  while (in_RDI[7] != 0) {
    lVar1 = in_RDI[7];
    pTVar2 = TestFilter::getNext((TestFilter *)in_RDI[7]);
    in_RDI[7] = pTVar2;
    if (lVar1 != 0) {
      TestFilter::~TestFilter((TestFilter *)0x122b53);
      operator_delete(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  while (in_RDI[8] != 0) {
    mem = (void *)in_RDI[8];
    pTVar2 = TestFilter::getNext((TestFilter *)in_RDI[8]);
    in_RDI[8] = pTVar2;
    if (mem != (void *)0x0) {
      TestFilter::~TestFilter((TestFilter *)0x122bb8);
      operator_delete(mem,in_stack_ffffffffffffffb8);
    }
  }
  SimpleString::~SimpleString((SimpleString *)0x122bd7);
  return;
}

Assistant:

CommandLineArguments::~CommandLineArguments()
{
    while(groupFilters_) {
        TestFilter* current = groupFilters_;
        groupFilters_ = groupFilters_->getNext();
        delete current;
    }
    while(nameFilters_) {
        TestFilter* current = nameFilters_;
        nameFilters_ = nameFilters_->getNext();
        delete current;
    }
}